

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.h
# Opt level: O2

bool __thiscall re2c::Opt::set_encoding(Opt *this,type_t t)

{
  type_t tVar1;
  bool bVar2;
  opt_t *poVar3;
  
  poVar3 = useropt_t::operator->(&this->useropt);
  tVar1 = (poVar3->encoding).type_;
  bVar2 = true;
  if (tVar1 != t) {
    if (tVar1 == ASCII) {
      (poVar3->encoding).type_ = t;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool set_encoding (Enc::type_t t)                    { return useropt->encoding.set (t); }